

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  int iVar2;
  void *in_RCX;
  undefined8 in_RDX;
  uint amount;
  long in_R8;
  word *result;
  unsigned_long value;
  AllocateResult AVar3;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  value = in_R8 - 1;
  assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::setTextPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::Text::Reader,capnp::_::BuilderArena*)::_lambda()_1_>
            (value,(anon_class_1_0_00000001 *)src);
  amount = (int)value + 8U >> 3;
  if (src == (EVP_PKEY_CTX *)0x0) {
    iVar2 = ((uint)(_DAT_00000028 - (long)dst >> 1) & 0xfffffffc) - 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _DAT_00000028;
    AVar3 = (AllocateResult)(auVar1 << 0x40);
    _DAT_00000028 = (ulong)amount * 8 + _DAT_00000028;
  }
  else {
    AVar3 = BuilderArena::allocate((BuilderArena *)src,amount);
    iVar2 = -3;
  }
  *(int *)dst = iVar2;
  *(int *)(dst + 4) = (int)value * 8 + 10;
  if (value != 0) {
    memcpy(AVar3.words,in_RCX,value);
  }
  *(SegmentBuilder **)(dst + 8) = AVar3.segment;
  *(undefined8 *)(dst + 0x10) = in_RDX;
  *(word **)(dst + 0x18) = AVar3.words;
  return (int)dst;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Text::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setTextPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}